

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O0

void __thiscall
soplex::SoPlexBase<double>::_storeBasisAsOldBasis
          (SoPlexBase<double> *this,DataArray<soplex::SPxSolverBase<double>::VarStatus> *rows,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *cols)

{
  bool bVar1;
  Verbosity VVar2;
  SoPlexBase<double> *in_RDI;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  Verbosity old_verbosity;
  Verbosity in_stack_ffffffffffffffd0;
  Verbosity VVar3;
  Verbosity in_stack_ffffffffffffffd4;
  Verbosity in_stack_ffffffffffffffd8;
  Verbosity in_stack_ffffffffffffffdc;
  Verbosity in_stack_ffffffffffffffe0;
  Verbosity in_stack_ffffffffffffffe4;
  
  bVar1 = _inStandardMode(in_RDI);
  if (bVar1) {
    if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
       (VVar2 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar2)) {
      in_stack_ffffffffffffffe4 = SPxOut::getVerbosity(&in_RDI->spxout);
      in_stack_ffffffffffffffe0 = INFO1;
      SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)&stack0xffffffffffffffe0);
      soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                         (char *)in_RDI);
      soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                         (char *)in_RDI);
      SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)&stack0xffffffffffffffe4);
    }
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator=
              ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
               CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               (DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator=
              ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
               CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               (DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    in_RDI->_hasOldBasis = true;
  }
  else {
    bVar1 = _inFeasMode(in_RDI);
    if (bVar1) {
      if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
         (VVar2 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar2)) {
        in_stack_ffffffffffffffdc = SPxOut::getVerbosity(&in_RDI->spxout);
        in_stack_ffffffffffffffd8 = INFO1;
        SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)&stack0xffffffffffffffd8);
        soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                           (char *)in_RDI);
        soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                           (char *)in_RDI);
        SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)&stack0xffffffffffffffdc);
      }
      DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator=
                ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
                 CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 (DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
                 CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator=
                ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
                 CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 (DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
                 CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      in_RDI->_hasOldFeasBasis = true;
    }
    else {
      bVar1 = _inUnbdMode(in_RDI);
      if (bVar1) {
        if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
           (VVar2 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar2)) {
          VVar2 = SPxOut::getVerbosity(&in_RDI->spxout);
          VVar3 = INFO1;
          SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)&stack0xffffffffffffffd0);
          soplex::operator<<((SPxOut *)CONCAT44(VVar2,VVar3),(char *)in_RDI);
          soplex::operator<<((SPxOut *)CONCAT44(VVar2,VVar3),(char *)in_RDI);
          SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)&stack0xffffffffffffffd4);
        }
        DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator=
                  ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
                   CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   (DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
                   CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
        DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator=
                  ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
                   CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   (DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
                   CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
        in_RDI->_hasOldUnbdBasis = true;
      }
    }
  }
  return;
}

Assistant:

void SoPlexBase<R>::_storeBasisAsOldBasis(DataArray< typename SPxSolverBase<R>::VarStatus >& rows,
      DataArray< typename SPxSolverBase<R>::VarStatus >& cols)
{
   if(_inStandardMode())
   {
      SPX_MSG_INFO1(spxout, spxout << "Store basis as old basis (from solver)" << "\n");
      _oldBasisStatusRows = rows;
      _oldBasisStatusCols = cols;
      _hasOldBasis = true;
   }
   else if(_inFeasMode())
   {
      SPX_MSG_INFO1(spxout, spxout << "Store basis as old basis (from solver - testing feasibility)" <<
                    "\n");
      _oldFeasBasisStatusRows = rows;
      _oldFeasBasisStatusCols = cols;
      _hasOldFeasBasis = true;
   }
   else if(_inUnbdMode())
   {
      SPX_MSG_INFO1(spxout, spxout << "Store basis as old basis (from solver - testing unboundedness)" <<
                    "\n");
      _oldUnbdBasisStatusRows = rows;
      _oldUnbdBasisStatusCols = cols;
      _hasOldUnbdBasis = true;
   }
}